

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epd.c
# Opt level: O2

void EpdMultiply(EpDouble *epd1,double value)

{
  double dVar1;
  EpTypeUnion EVar2;
  EpType val_1;
  EpDouble epd2;
  EpTypeUnion local_30;
  int local_28;
  
  dVar1 = (epd1->type).value;
  if (((uint)((ulong)dVar1 >> 0x34) < 0xfff || ((ulong)dVar1 & 0xfffffffffffff) != 0x8000000000000)
     && (((ulong)value & 0xfffffffffffff) != 0x8000000000000 || (ulong)value < 0xfff0000000000000))
  {
    if (ABS(value) != INFINITY && ABS(dVar1) != INFINITY) {
      if (((ulong)dVar1 & 0x7ff0000000000000) == 0x3ff0000000000000) {
        EpdConvert(value,(EpDouble *)&local_30.bits);
        (epd1->type).value = dVar1 * local_30.value;
        epd1->exponent = epd1->exponent + local_28;
        EpdNormalize(epd1);
        return;
      }
      __assert_fail("epd1->type.bits.exponent == EPD_MAX_BIN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/epd/epd.c"
                    ,0xdf,"void EpdMultiply(EpDouble *, double)");
    }
    EpdConvert(value,(EpDouble *)&local_30.bits);
    EVar2 = (EpTypeUnion)
            (((ulong)dVar1 ^ (ulong)local_30) & 0x8000000000000000 | 0x7ff0000000000000);
  }
  else {
    EVar2.value = -NAN;
  }
  epd1->type = EVar2;
  epd1->exponent = 0;
  return;
}

Assistant:

void
EpdMultiply(EpDouble *epd1, double value)
{
  EpDouble      epd2;
  double        tmp;
  int           exponent;

  if (EpdIsNan(epd1) || IsNanDouble(value)) {
    EpdMakeNan(epd1);
    return;
  } else if (EpdIsInf(epd1) || IsInfDouble(value)) {
    int sign;

    EpdConvert(value, &epd2);
    sign = epd1->type.bits.sign ^ epd2.type.bits.sign;
    EpdMakeInf(epd1, sign);
    return;
  }

  assert(epd1->type.bits.exponent == EPD_MAX_BIN);

  EpdConvert(value, &epd2);
  tmp = epd1->type.value * epd2.type.value;
  exponent = epd1->exponent + epd2.exponent;
  epd1->type.value = tmp;
  epd1->exponent = exponent;
  EpdNormalize(epd1);
}